

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DHMap.hpp
# Opt level: O0

bool __thiscall
Lib::DHMap<SAT::SATClause_*,_Lib::EmptyStruct,_Lib::DefaultHash,_Lib::DefaultHash2>::insert
          (void *param_1,SATClause *param_2)

{
  Entry *pEVar1;
  bool bVar2;
  bool exists;
  Entry *e;
  SATClause **key;
  DHMap<SAT::SATClause_*,_Lib::EmptyStruct,_Lib::DefaultHash,_Lib::DefaultHash2>
  *in_stack_fffffffffffffff8;
  
  key = (SATClause **)param_1;
  ensureExpanded((DHMap<SAT::SATClause_*,_Lib::EmptyStruct,_Lib::DefaultHash,_Lib::DefaultHash2> *)
                 param_1);
  pEVar1 = findEntryToInsert(in_stack_fffffffffffffff8,key);
  bVar2 = false;
  if ((uint)(pEVar1->field_0)._infoData >> 2 == *param_1) {
    bVar2 = ((pEVar1->field_0)._infoData & 1U) == 0;
  }
  if (!bVar2) {
    if ((uint)(pEVar1->field_0)._infoData >> 2 == *param_1) {
      *(uint *)((long)param_1 + 8) = *(uint *)((long)param_1 + 8) - 1;
    }
    else {
      (pEVar1->field_0)._infoData = (pEVar1->field_0)._infoData & 3U | *param_1 << 2;
      (pEVar1->field_0)._infoData = (pEVar1->field_0)._infoData & 0xfffffffd;
    }
    (pEVar1->field_0)._infoData = (pEVar1->field_0)._infoData & 0xfffffffe;
    pEVar1->_key = param_2;
    *(uint *)((long)param_1 + 4) = *(uint *)((long)param_1 + 4) + 1;
  }
  return (bool)(bVar2 ^ 1);
}

Assistant:

bool insert(Key key, Val val)
  {
    ensureExpanded();
    Entry* e=findEntryToInsert(key);
    bool exists = e->_info.timestamp==_timestamp && !e->_info.deleted;
    if(!exists) {
      if(e->_info.timestamp!=_timestamp) {
	e->_info.timestamp=_timestamp;
	//no collision has occured on this entry while this _timestamp is set
	e->_info.collision=0;
      } else {
	ASS(e->_info.deleted);
	_deleted--;
      }
      e->_info.deleted=0;
      e->_key = std::move(key);
      e->_val = std::move(val);
      _size++;
    }
    return !exists;

  }